

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_randomizer_options.cpp
# Opt level: O2

void apply_randomizer_options(RandomizerOptions *options,RandomizerWorld *world)

{
  ushort uVar1;
  pointer ppIVar2;
  pointer ppWVar3;
  pointer ppIVar4;
  pointer pbVar5;
  bool bVar6;
  byte bVar7;
  uint8_t uVar8;
  uint16_t uVar9;
  unsigned_short uVar10;
  int iVar11;
  uint uVar12;
  string_type *psVar13;
  reference pbVar14;
  size_type sVar15;
  Item *pIVar16;
  string_type *__str;
  reference pbVar17;
  WorldPath *pWVar18;
  WorldNode *pWVar19;
  WorldNode *pWVar20;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> _Var21;
  size_type sVar22;
  mapped_type *ppSVar23;
  SpawnLocation *spawn;
  HintSource *hint_source;
  uint8_t i;
  long lVar24;
  uint8_t bit;
  char cVar25;
  pointer ppWVar26;
  Item **ppIVar27;
  string *string_hex_id;
  pointer __str_00;
  initializer_list<Flag> __l;
  initializer_list<Item_*> __l_00;
  allocator_type local_5fa;
  allocator<char> local_5f9;
  vector<Flag,_std::allocator<Flag>_> flags_to_add;
  Json game_strings_json;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_to_empty;
  uint8_t id;
  undefined7 uStack_547;
  pointer ppWStack_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_520;
  _Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> local_508;
  string local_4e8;
  _Any_data local_4c8;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  _Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> local_4a8;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_488;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_468;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_448;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_428;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin1;
  
  (world->super_World)._starting_golds = options->_starting_gold;
  (world->super_World)._starting_life = options->_starting_life;
  __begin1.anchor.m_object = (pointer)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.anchor.m_it.object_iterator._M_current._2_1_ = 7;
  __begin1.anchor.m_it.object_iterator._M_current._0_2_ = 0;
  __begin1.anchor.m_it.array_iterator._M_current =
       (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.anchor.m_it.primitive_iterator.m_it._0_2_ = 0;
  __begin1.anchor.m_it.primitive_iterator.m_it._2_1_ = 5;
  __begin1.array_index = (size_t)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.array_index_last._2_1_ = 4;
  __begin1.array_index_last._0_2_ = 0;
  __begin1.array_index_str._M_dataplus._M_p = (pointer)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.array_index_str._M_string_length._0_2_ = 0;
  __begin1.array_index_str._M_string_length._2_1_ = 0;
  __begin1.array_index_str.field_2._M_allocated_capacity =
       (size_type)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.array_index_str.field_2._8_2_ = 2;
  __begin1.array_index_str.field_2._M_local_buf[10] = '\a';
  __begin1.empty_str._M_dataplus._M_p = (pointer)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.empty_str._M_string_length._2_1_ = 4;
  __begin1.empty_str._M_string_length._0_2_ = 2;
  __begin1.empty_str.field_2._M_allocated_capacity = (size_type)&PTR_to_json_abi_cxx11__002468a8;
  __begin1.empty_str.field_2._8_2_ = 2;
  __begin1.empty_str.field_2._M_local_buf[10] = '\x02';
  __l._M_len = 0x3e;
  __l._M_array = (iterator)&__begin1;
  std::vector<Flag,_std::allocator<Flag>_>::vector
            (&flags_to_add,__l,(allocator_type *)local_4c8._M_pod_data);
  if (options->_all_trees_visited_at_start == true) {
    for (cVar25 = '\0'; cVar25 != '\b'; cVar25 = cVar25 + '\x01') {
      __begin1.anchor.m_object = (pointer)&PTR_to_json_abi_cxx11__002468a8;
      __begin1.anchor.m_it.object_iterator._M_current._0_2_ = 0x23;
      __begin1.anchor.m_it.object_iterator._M_current._2_1_ = cVar25;
      std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>(&flags_to_add,(Flag *)&__begin1);
    }
    __begin1.anchor.m_object = (pointer)&PTR_to_json_abi_cxx11__002468a8;
    __begin1.anchor.m_it.object_iterator._M_current._0_2_ = 0x25;
    __begin1.anchor.m_it.object_iterator._M_current._2_1_ = 0;
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>(&flags_to_add,(Flag *)&__begin1);
    __begin1.anchor.m_object = (pointer)&PTR_to_json_abi_cxx11__002468a8;
    __begin1.anchor.m_it.object_iterator._M_current._0_2_ = 0x25;
    __begin1.anchor.m_it.object_iterator._M_current._2_1_ = 1;
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>(&flags_to_add,(Flag *)&__begin1);
  }
  if (options->_remove_gumi_boulder == true) {
    __begin1.anchor.m_object = (pointer)&PTR_to_json_abi_cxx11__002468a8;
    __begin1.anchor.m_it.object_iterator._M_current._0_2_ = 2;
    __begin1.anchor.m_it.object_iterator._M_current._2_1_ = 6;
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>(&flags_to_add,(Flag *)&__begin1);
  }
  std::vector<Flag,std::allocator<Flag>>::
  insert<__gnu_cxx::__normal_iterator<Flag*,std::vector<Flag,std::allocator<Flag>>>,void>
            ((vector<Flag,std::allocator<Flag>> *)&(world->super_World)._starting_flags,
             (world->super_World)._starting_flags.super__Vector_base<Flag,_std::allocator<Flag>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>)
             flags_to_add.super__Vector_base<Flag,_std::allocator<Flag>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>)
             flags_to_add.super__Vector_base<Flag,_std::allocator<Flag>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::_Vector_base<Flag,_std::allocator<Flag>_>::~_Vector_base
            ((_Vector_base<Flag,_std::allocator<Flag>_> *)&flags_to_add);
  local_4c8._M_unused._M_object = &options->_model_patch_items;
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin(&__begin1,
          (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)&local_4c8);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&flags_to_add,
        (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&local_4c8);
  while( true ) {
    bVar6 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1.anchor,
                       (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&flags_to_add);
    if (!bVar6) break;
    psVar13 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key(&__begin1);
    pbVar14 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&__begin1.anchor);
    iVar11 = std::__cxx11::stoi(psVar13,(size_t *)0x0,10);
    id = (char)iVar11;
    sVar15 = std::
             map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
             ::count((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                      *)world,&id);
    if (sVar15 == 0) {
      pIVar16 = Item::from_json(id,pbVar14);
      World::add_item(&world->super_World,pIVar16);
    }
    else {
      pIVar16 = World::item(&world->super_World,id);
      Item::apply_json(pIVar16,pbVar14);
    }
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&flags_to_add);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value(&__begin1);
  bVar7 = options->_jewel_count;
  if (bVar7 < 6) {
    if (bVar7 == 5) {
      pIVar16 = World::item(&world->super_World,'\"');
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin1,"Yellow Jewel",(allocator<char> *)&flags_to_add);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pIVar16->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
      std::__cxx11::string::~string((string *)&__begin1);
      pIVar16 = World::item(&world->super_World,'\"');
      (**pIVar16->_vptr_Item)(pIVar16,500);
      pIVar16 = World::item(&world->super_World,'!');
      pIVar16->_max_quantity = '\x01';
      bVar7 = options->_jewel_count;
    }
    if (3 < bVar7) {
      pIVar16 = World::item(&world->super_World,'!');
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin1,"Blue Jewel",(allocator<char> *)&flags_to_add);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pIVar16->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
      std::__cxx11::string::~string((string *)&__begin1);
      pIVar16 = World::item(&world->super_World,'!');
      (**pIVar16->_vptr_Item)(pIVar16,500);
      pIVar16 = World::item(&world->super_World,'!');
      pIVar16->_max_quantity = '\x01';
      bVar7 = options->_jewel_count;
    }
    if (2 < bVar7) {
      pIVar16 = World::item(&world->super_World,'4');
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin1,"Green Jewel",(allocator<char> *)&flags_to_add);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pIVar16->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
      std::__cxx11::string::~string((string *)&__begin1);
      pIVar16 = World::item(&world->super_World,'4');
      (**pIVar16->_vptr_Item)(pIVar16,500);
      pIVar16 = World::item(&world->super_World,'4');
      uVar8 = '\x01';
      goto LAB_0016491c;
    }
  }
  else {
    pIVar16 = World::item(&world->super_World,'(');
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"Kazalt Jewel",(allocator<char> *)&flags_to_add);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pIVar16->_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
    std::__cxx11::string::~string((string *)&__begin1);
    uVar8 = options->_jewel_count;
LAB_0016491c:
    pIVar16->_max_quantity = uVar8;
  }
  for (lVar24 = 0; lVar24 != 0x3e; lVar24 = lVar24 + 1) {
    pIVar16 = World::item(&world->super_World,(uint8_t)lVar24);
    bVar7 = (options->_starting_items)._M_elems[lVar24];
    if (8 < bVar7) {
      bVar7 = 9;
    }
    pIVar16->_starting_quantity = bVar7;
  }
  if (options->_use_armor_upgrades != false) {
    pIVar16 = World::item(&world->super_World,'\t');
    (**pIVar16->_vptr_Item)(pIVar16,0xfa);
    pIVar16 = World::item(&world->super_World,'\n');
    (**pIVar16->_vptr_Item)(pIVar16,0xfa);
    pIVar16 = World::item(&world->super_World,'\v');
    (**pIVar16->_vptr_Item)(pIVar16,0xfa);
    pIVar16 = World::item(&world->super_World,'\f');
    (**pIVar16->_vptr_Item)(pIVar16,0xfa);
  }
  if (options->_consumable_record_book == true) {
    pIVar16 = World::item(&world->super_World,'#');
    pIVar16->_max_quantity = '\t';
    pIVar16 = World::item(&world->super_World,'#');
    uVar1 = pIVar16->_gold_value;
    pIVar16 = World::item(&world->super_World,'#');
    (**pIVar16->_vptr_Item)(pIVar16,(ulong)(uVar1 / 5),(ulong)(uVar1 % 5));
  }
  if (options->_consumable_spell_book == true) {
    pIVar16 = World::item(&world->super_World,'$');
    pIVar16->_max_quantity = '\t';
    pIVar16 = World::item(&world->super_World,'$');
    uVar1 = pIVar16->_gold_value;
    pIVar16 = World::item(&world->super_World,'$');
    (**pIVar16->_vptr_Item)(pIVar16,(ulong)(uVar1 / 5),(ulong)(uVar1 % 5));
  }
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8 = 0;
  uStack_4b0 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[15116]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&game_strings_json,
             (uchar (*) [15116])
             "{\n    \"emptiedIndices\": [\n        // Debug menu strings\n        \"1d\", \"1e\", \"1f\", \"20\",\n        \"23\", \"24\", \"25\", \"26\", \"27\", \"28\", \"29\", \"2a\", \"2b\", \"2c\", \"2d\", \"2e\", \"2f\", \n              \"30\", \"31\", \"32\", \"33\", \"34\", \"35\", \"36\", \"37\", \"38\", \"39\", \"3a\", \"3b\", \n              \"3c\", \"3d\", \"3e\", \"3f\", \"40\", \"41\", \"42\", \"43\", \"44\", \"45\", \"46\", \"47\", \n              \"48\", \"49\", \"4a\", \"4b\", \"4c\", \"4d\", \n        // Unreachable Massan elder dialogues\n        \"148\", \"149\",\n        // Unreachable Fara dialogues\n        \"14f\", \"150\",\n        // Pockets boulder dialogue\n        \"180\", \"181\", \"182\", \"183\", \"184\", \"185\", \"186\", \"187\", \"188\", \"189\", \"18a\", \"18b\", \n        \"18c\", \"18d\",\n        // Unreachable Prospero dialogues\n        \"1c6\", \"1c7\", \"1c8\", \"1c9\", \"1ca\", \"1cb\", \"1cc\", \"1cd\", \"1ce\", \"1cf\", \"1d0\", \"1d1\",\n               \"1d2\", \"1d3\", \"1d4\", \"1d5\", \"1d6\", \"1d7\", \"1d8\", \"1d9\",\n        // Arthur gift cutscene\n        \"497\", \"498\", \"499\", \"49a\", \"49b\",\n        // Fara discovering Nigel fallen from waterfall cutscene\n        \"52e\", \"52f\", \"530\", \"531\", \"532\", \"533\", \"534\",\n        // Cutscene spying on Gumi ritual\n        \"54d\", \"54e\", \"54f\", \"550\", \"551\",\n        // Kayla raft cutscene\n        \"572\", \"573\", \"574\", \"575\", \"576\", \"577\", \"578\", \n        // Lithograph cutscene\n        \"579\", \"57a\", \"57b\", \"57c\", \"57d\", \"57e\", \"57f\", \"580\", \"581\", \"582\", \"583\", \"584\", \"585\", \n               \"586\", \"587\", \"588\", \"589\", \"58a\", \"58b\", \"58c\", \"58d\", \"58e\", \"58f\", \"590\", \"591\", \n               \"592\", \n        // Mercator gate guards\n        \"5a0\", \"5a1\", \"5a2\", \"5a3\", \"5a4\", \"5a5\", \"5a6\", \"5a7\", \"5a8\", \"5a9\",\n        // Fahl intermediary dialogues\n        \"5b6\", \"5b7\", \"5b8\", \"5b9\", \"5ba\", \"5bb\", \"5bc\", \"5bd\", \"5be\", \"5bf\", \"5c0\", \"5c1\", \n               \"5c2\", \"5c3\",\n        // Mercator castle backdoor cutscene\n        \"5e1\", \"5e2\", \"5e3\", \"5e4\", \"5e5\", \"5e6\", \"5e7\", \"5e8\", \"5e9\", \"5ea\", \"5eb\", \"5ec\", \"5ed\", \n        // Mercator cutscenes (Madame Yard & castle)\n        \"5f6\", \"5f7\", \"5f8\", \"5f9\", \"5fa\", \"5fb\", \"5fc\", \"5fd\", \"5fe\",..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_4c8,true,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin1,"emptiedIndices",(allocator<char> *)&flags_to_add);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::at(&game_strings_json,(key_type *)&__begin1);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&strings_to_empty);
  std::__cxx11::string::~string((string *)&__begin1);
  pbVar5 = strings_to_empty.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__str_00 = strings_to_empty.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __str_00 != pbVar5;
      __str_00 = __str_00 + 1) {
    uVar12 = std::__cxx11::stoi(__str_00,(size_t *)0x0,0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((world->super_World)._game_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
               (ulong)((uVar12 & 0xffff) << 5)),"");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin1,"patches",(allocator<char> *)&flags_to_add);
  local_4e8._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at(&game_strings_json,(key_type *)&__begin1);
  std::__cxx11::string::~string((string *)&__begin1);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)&__begin1,
          (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)&local_4e8);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&flags_to_add,
        (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&local_4e8);
  while( true ) {
    bVar6 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__begin1,
                       (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&flags_to_add);
    if (!bVar6) break;
    __str = nlohmann::detail::
            iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)&__begin1);
    pbVar17 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&__begin1);
    uVar12 = std::__cxx11::stoi(__str,(size_t *)0x0,0x10);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,pbVar17);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((world->super_World)._game_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
               (ulong)((uVar12 & 0xffff) << 5)),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id);
    std::__cxx11::string::~string((string *)&id);
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&__begin1);
  }
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&flags_to_add);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&__begin1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&id,"Only the bearers of the ",(allocator<char> *)&local_468);
  std::__cxx11::to_string(&local_4e8,(uint)options->_jewel_count);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags_to_add,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,&local_4e8
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags_to_add,
                 " jewels\n are worthy of entering\n King Nole\'s domain...\x1e");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((world->super_World)._game_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x22,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
  std::__cxx11::string::~string((string *)&__begin1);
  std::__cxx11::string::~string((string *)&flags_to_add);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings_to_empty);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&game_strings_json);
  if (options->_remove_gumi_boulder == true) {
    pWVar18 = (WorldPath *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"route_gumi_ryuma",(allocator<char> *)&strings_to_empty);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"gumi",(allocator<char> *)&game_strings_json);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    local_4b8 = 0;
    local_4c8._M_unused._M_object = (void *)0x0;
    local_4c8._8_8_ = 0;
    _id = (pointer)0x0;
    ppWStack_540 = (pointer)0x0;
    local_538._M_allocated_capacity = 0;
    local_4e8._M_dataplus._M_p = (pointer)0x0;
    local_4e8._M_string_length = 0;
    local_4e8.field_2._M_allocated_capacity = 0;
    WorldPath::WorldPath
              (pWVar18,pWVar19,pWVar20,1,(vector<Item_*,_std::allocator<Item_*>_> *)&local_4c8,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&id,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_4e8);
    RandomizerWorld::add_path(world,pWVar18);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
              ((_Vector_base<Item_*,_std::allocator<Item_*>_> *)&local_4e8);
    std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base
              ((_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> *)&id);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
              ((_Vector_base<Item_*,_std::allocator<Item_*>_> *)&local_4c8);
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  if (options->_enemy_jumping_in_logic == true) {
    pWVar18 = (WorldPath *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"route_lake_shrine",(allocator<char> *)&local_520);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"route_lake_shrine_cliff",(allocator<char> *)&local_508);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    strings_to_empty.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    strings_to_empty.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    strings_to_empty.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    game_strings_json.m_type = null;
    game_strings_json._1_7_ = 0;
    game_strings_json.m_value.object = (object_t *)0x0;
    local_468._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_468._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath
              (pWVar18,pWVar19,pWVar20,1,
               (vector<Item_*,_std::allocator<Item_*>_> *)&strings_to_empty,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&game_strings_json,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_468);
    RandomizerWorld::add_path(world,pWVar18);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_468);
    std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base
              ((_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> *)&game_strings_json);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
              ((_Vector_base<Item_*,_std::allocator<Item_*>_> *)&strings_to_empty);
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"mir_tower_sector",(allocator<char> *)&local_520);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"mir_tower_sector_tree_ledge",(allocator<char> *)&local_508);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    pWVar18 = RandomizerWorld::path(world,pWVar19,pWVar20);
    ppIVar2 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar2) {
      (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar2;
    }
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  if (options->_tree_cutting_glitch_in_logic == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"mir_tower_sector",(allocator<char> *)&local_520);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"mir_tower_sector_tree_coast",(allocator<char> *)&local_508);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    pWVar18 = RandomizerWorld::path(world,pWVar19,pWVar20);
    ppIVar2 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar2) {
      (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar2;
    }
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"mir_tower_sector",(allocator<char> *)&local_520);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"mir_tower_sector_tree_ledge",(allocator<char> *)&local_508);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    pWVar18 = RandomizerWorld::path(world,pWVar19,pWVar20);
    ppIVar2 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar2) {
      (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar2;
    }
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  if (options->_damage_boosting_in_logic == true) {
    ppWVar3 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppWVar26 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppWVar26 != ppWVar3;
        ppWVar26 = ppWVar26 + 1) {
      pWVar18 = *ppWVar26;
      ppIVar2 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppIVar4 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __begin1.anchor.m_object = (pointer)World::item(&world->super_World,'\x06');
      _Var21 = std::
               __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                         (ppIVar2,ppIVar4,&__begin1);
      ppIVar27 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (_Var21._M_current != ppIVar27) {
        std::vector<Item_*,_std::allocator<Item_*>_>::erase
                  (&pWVar18->_required_items,(const_iterator)_Var21._M_current);
        ppIVar27 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      ppIVar2 = (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __begin1.anchor.m_object = (pointer)World::item(&world->super_World,'\x05');
      _Var21 = std::
               __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                         (ppIVar2,ppIVar27,&__begin1);
      if (_Var21._M_current !=
          (pWVar18->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<Item_*,_std::allocator<Item_*>_>::erase
                  (&pWVar18->_required_items,(const_iterator)_Var21._M_current);
      }
    }
  }
  if (options->_allow_whistle_usage_behind_trees == true) {
    pWVar18 = (WorldPath *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"greenmaze_post_whistle",(allocator<char> *)&local_4a8);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags_to_add,"greenmaze_pre_whistle",(allocator<char> *)&local_448);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    local_488._M_impl.super__Vector_impl_data._M_start =
         (pointer)World::item(&world->super_World,' ');
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_488;
    std::vector<Item_*,_std::allocator<Item_*>_>::vector
              ((vector<Item_*,_std::allocator<Item_*>_> *)&local_520,__l_00,&local_5fa);
    local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_508._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_508._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_428._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath
              (pWVar18,pWVar19,pWVar20,1,(vector<Item_*,_std::allocator<Item_*>_> *)&local_520,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_508,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_428);
    RandomizerWorld::add_path(world,pWVar18);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_428);
    std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base(&local_508);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_520);
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin1,"king_nole_cave",(allocator<char> *)&local_488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags_to_add,"kazalt",(allocator<char> *)&local_4a8);
  pWVar18 = RandomizerWorld::path(world,(string *)&__begin1,(string *)&flags_to_add);
  std::__cxx11::string::~string((string *)&flags_to_add);
  std::__cxx11::string::~string((string *)&__begin1);
  bVar7 = options->_jewel_count;
  if (bVar7 < 6) {
    if (bVar7 != 0) {
      pIVar16 = World::item(&world->super_World,'(');
      WorldPath::add_required_item(pWVar18,pIVar16);
      if (1 < options->_jewel_count) {
        pIVar16 = World::item(&world->super_World,'*');
        WorldPath::add_required_item(pWVar18,pIVar16);
        if (2 < options->_jewel_count) {
          pIVar16 = World::item(&world->super_World,'4');
          WorldPath::add_required_item(pWVar18,pIVar16);
          if (3 < options->_jewel_count) {
            pIVar16 = World::item(&world->super_World,'!');
            WorldPath::add_required_item(pWVar18,pIVar16);
            if (4 < options->_jewel_count) {
              pIVar16 = World::item(&world->super_World,'\"');
              WorldPath::add_required_item(pWVar18,pIVar16);
            }
          }
        }
      }
    }
  }
  else {
    for (uVar12 = 0; uVar12 < bVar7; uVar12 = uVar12 + 1) {
      pIVar16 = World::item(&world->super_World,'(');
      WorldPath::add_required_item(pWVar18,pIVar16);
      bVar7 = options->_jewel_count;
    }
  }
  RandomizerOptions::goal_abi_cxx11_((string *)&__begin1,options);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &__begin1,"reach_kazalt");
  std::__cxx11::string::~string((string *)&__begin1);
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"end",(allocator<char> *)&flags_to_add);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    pWVar18->_to_node = pWVar19;
    std::__cxx11::string::~string((string *)&__begin1);
    pWVar18 = (WorldPath *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,"end",(allocator<char> *)&local_5fa);
    pWVar19 = RandomizerWorld::node(world,(string *)&__begin1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&flags_to_add,"kazalt",&local_5f9);
    pWVar20 = RandomizerWorld::node(world,(string *)&flags_to_add);
    local_488._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_488._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_488._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_448._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath
              (pWVar18,pWVar19,pWVar20,1,(vector<Item_*,_std::allocator<Item_*>_> *)&local_488,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_4a8,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_448);
    RandomizerWorld::add_path(world,pWVar18);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_448);
    std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base(&local_4a8);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_488);
    std::__cxx11::string::~string((string *)&flags_to_add);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  local_4c8._M_unused._M_object = &options->_model_patch_spawns;
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin(&__begin1,
          (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)&local_4c8);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&flags_to_add,
        (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)&local_4c8);
  while( true ) {
    bVar6 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1.anchor,
                       (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&flags_to_add);
    if (!bVar6) break;
    psVar13 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key(&__begin1);
    pbVar14 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&__begin1.anchor);
    sVar22 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
             ::count(&world->_available_spawn_locations,psVar13);
    if (sVar22 == 0) {
      spawn = SpawnLocation::from_json(psVar13,pbVar14);
      RandomizerWorld::add_spawn_location(world,spawn);
    }
    else {
      ppSVar23 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
                 ::at(&world->_available_spawn_locations,psVar13);
      SpawnLocation::apply_json(*ppSVar23,pbVar14);
    }
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&flags_to_add);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~iteration_proxy_value(&__begin1);
  for (lVar24 = 0x108; lVar24 != 0x14d; lVar24 = lVar24 + 1) {
    *(ushort *)(&(world->super_World)._items._M_t._M_impl.field_0x0 + lVar24 * 2) =
         (ushort)(options->_starting_items)._M_elems[lVar24 + -0x55];
  }
  if (options->_jewel_count < 6) {
    if (options->_jewel_count == 0) goto LAB_001657ca;
    uVar9 = RandomizerWorld::item_quantity(world,'(');
    if (uVar9 == 0) {
      (world->_item_quantities)._M_elems[0x28] = 1;
    }
    if (options->_jewel_count < 2) goto LAB_001657ca;
    uVar9 = RandomizerWorld::item_quantity(world,'*');
    if (uVar9 == 0) {
      (world->_item_quantities)._M_elems[0x2a] = 1;
    }
    if (options->_jewel_count < 3) goto LAB_001657ca;
    uVar9 = RandomizerWorld::item_quantity(world,'4');
    if (uVar9 == 0) {
      (world->_item_quantities)._M_elems[0x34] = 1;
    }
    if (options->_jewel_count < 4) goto LAB_001657ca;
    uVar9 = RandomizerWorld::item_quantity(world,'!');
    if (uVar9 == 0) {
      (world->_item_quantities)._M_elems[0x21] = 1;
    }
    if (options->_jewel_count < 5) goto LAB_001657ca;
    uVar9 = RandomizerWorld::item_quantity(world,'\"');
    if (uVar9 != 0) goto LAB_001657ca;
    uVar10 = 1;
  }
  else {
    uVar9 = RandomizerWorld::item_quantity(world,'(');
    if (options->_jewel_count <= uVar9) goto LAB_001657ca;
    (world->_item_quantities)._M_elems[0x28] = (ushort)options->_jewel_count;
    (world->_item_quantities)._M_elems[0x2a] = 0;
    (world->_item_quantities)._M_elems[0x34] = 0;
    (world->_item_quantities)._M_elems[0x21] = 0;
    uVar10 = 0;
  }
  (world->_item_quantities)._M_elems[0x22] = uVar10;
LAB_001657ca:
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin(&__begin1.anchor,&options->_model_patch_hint_sources);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)&flags_to_add,&options->_model_patch_hint_sources);
  while( true ) {
    bVar6 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1.anchor,(const_iterator *)&flags_to_add);
    if (!bVar6) break;
    pbVar14 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&__begin1.anchor);
    hint_source = HintSource::from_json(pbVar14,&world->_nodes);
    RandomizerWorld::add_hint_source(world,hint_source);
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&__begin1.anchor);
  }
  return;
}

Assistant:

void apply_randomizer_options(const RandomizerOptions& options, RandomizerWorld& world)
{
    world.starting_golds(options.starting_gold());
    world.starting_life(options.starting_life());

    patch_starting_flags(world, options);
    patch_items(world, options);
    patch_game_strings(world, options);

    apply_options_on_logic_paths(options, world);
    apply_options_on_spawn_locations(options, world);
    apply_options_on_item_distributions(options, world);
    apply_options_on_hint_sources(options, world);
}